

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::CFIReaderImpl::QName::QName(QName *this,FIQName *qname)

{
  char *pcVar1;
  allocator<char> local_23;
  allocator<char> local_22;
  allocator<char> local_21;
  
  pcVar1 = qname->prefix;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)this,pcVar1,&local_21);
  pcVar1 = qname->uri;
  if (pcVar1 == (char *)0x0) {
    pcVar1 = "";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->uri,pcVar1,&local_22);
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name,qname->name,&local_23);
  return;
}

Assistant:

inline QName(const FIQName &qname): prefix(qname.prefix ? qname.prefix : ""), uri(qname.uri ? qname.uri : ""), name(qname.name) {}